

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_refresh_registrations_adds_a_refresh_control_to_sync_with_correct_sid_Test
::
~SubjectSetRegisterTest_next_subscription_sync_after_refresh_registrations_adds_a_refresh_control_to_sync_with_correct_sid_Test
          (SubjectSetRegisterTest_next_subscription_sync_after_refresh_registrations_adds_a_refresh_control_to_sync_with_correct_sid_Test
           *this)

{
  SubjectSetRegisterTest_next_subscription_sync_after_refresh_registrations_adds_a_refresh_control_to_sync_with_correct_sid_Test
  *this_local;
  
  ~SubjectSetRegisterTest_next_subscription_sync_after_refresh_registrations_adds_a_refresh_control_to_sync_with_correct_sid_Test
            (this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_refresh_registrations_adds_a_refresh_control_to_sync_with_correct_sid)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_SUBJECT3, false);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();

    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT2, true);
    message = subject_register.NextSubscriptionSync();

    SubscriptionSync* actual_message = message.operator->();

    EXPECT_EQ(ControlOperationEnum::REFRESH, message->GetControls().begin()->second);
}